

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O3

void __thiscall
burst::k_ary_search_set<long,std::less<void>>::
initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
          (k_ary_search_set<long,std::less<void>> *this,
          iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
          *range)

{
  ulong *puVar1;
  long *plVar2;
  long *plVar3;
  k_ary_search_set_branch *pkVar4;
  long *plVar5;
  long lVar6;
  unsigned_long uVar7;
  pointer puVar8;
  long *plVar9;
  _Elt_pointer pkVar10;
  ulong *puVar11;
  long lVar12;
  ulong uVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> counters;
  value_type branch;
  stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
  branches;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  k_ary_search_set_branch local_c8;
  k_ary_search_set_branch local_a8;
  _Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
  local_88;
  
  plVar2 = (range->
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
           ).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin._M_current;
  plVar3 = (range->
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
           ).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_End._M_current;
  plVar5 = plVar2;
  if (plVar2 != plVar3) {
    while (plVar9 = plVar5 + 1, plVar9 != plVar3) {
      lVar12 = *plVar5;
      plVar5 = plVar9;
      if (*plVar9 <= lVar12) {
        __assert_fail("std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                      ,0x149,
                      "void burst::k_ary_search_set<long>::initialize_trusted(const RandomAccessRange &) [Value = long, Compare = std::less<void>, RandomAccessRange = boost::iterator_range<__gnu_cxx::__normal_iterator<const long *, std::vector<long>>>]"
                     );
      }
    }
    std::vector<long,_std::allocator<long>_>::resize
              ((vector<long,_std::allocator<long>_> *)this,(long)plVar3 - (long)plVar2 >> 3);
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
    _M_initialize_map(&local_88,0);
    local_c8.index = 0;
    local_c8.size = *(long *)(this + 8) - *(long *)this >> 3;
    uVar7 = intlog<unsigned_long,unsigned_long>(local_c8.size,*(unsigned_long *)(this + 0x18));
    local_c8.height = uVar7 + 1;
    local_c8.preceding_elements = 0;
    std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
    emplace_back<burst::k_ary_search_set_branch>
              ((deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                *)&local_88,&local_c8);
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pkVar4 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_c8.index = pkVar4[0xf].index;
          local_c8.size = pkVar4[0xf].size;
          local_c8.height = pkVar4[0xf].height;
          local_c8.preceding_elements = pkVar4[0xf].preceding_elements;
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x10;
          pkVar10 = local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0xf;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          pkVar10 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          local_c8.index = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].index;
          local_c8.size = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].size;
          local_c8.height = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].height;
          local_c8.preceding_elements =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].preceding_elements;
        }
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (ulong *)0x0;
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = pkVar10;
        k_ary_search_set<long,_std::less<void>_>::fill_counters
                  ((k_ary_search_set<long,_std::less<void>_> *)this,&local_c8,&local_e8);
        fill_node<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
                  (this,&local_c8,&local_e8,range);
        if (*local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start != 0) {
          local_a8.index = (*(long *)(this + 0x18) + local_c8.index * *(long *)(this + 0x18)) - 1;
          local_a8.size =
               *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
          local_a8.height = local_c8.height - 1;
          local_a8.preceding_elements = local_c8.preceding_elements;
          std::
          deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
          emplace_back<burst::k_ary_search_set_branch>
                    ((deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                      *)&local_88,&local_a8);
        }
        if ((ulong)((long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start) < 9) {
LAB_0010ca9c:
          if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (ulong *)0x0) goto LAB_0010caa1;
        }
        else {
          if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[1] !=
              *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + 1) {
            puVar11 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1;
            puVar8 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar12 = 1;
            uVar13 = 2;
            do {
              local_a8.index =
                   (*(long *)(this + 0x18) + -1) * uVar13 + local_c8.index * *(long *)(this + 0x18);
              local_a8.size = ~*puVar8 + *puVar11;
              local_a8.height = local_c8.height - 1;
              local_a8.preceding_elements = *puVar8 + local_c8.preceding_elements + 1;
              std::
              deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
              ::emplace_back<burst::k_ary_search_set_branch>
                        ((deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                          *)&local_88,&local_a8);
              if ((ulong)((long)local_e8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_e8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar13)
              goto LAB_0010ca9c;
              puVar11 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar12 + 1;
              lVar6 = uVar13 - 1;
              puVar8 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar12;
              puVar1 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar13;
              lVar12 = lVar12 + 1;
              uVar13 = uVar13 + 1;
            } while (*puVar1 !=
                     local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar6] + 1);
          }
LAB_0010caa1:
          operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::
    _Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
    ~_Deque_base(&local_88);
  }
  return;
}

Assistant:

void initialize_trusted (const RandomAccessRange & range)
        {
            BOOST_ASSERT
            (
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end()
            );
            if (not range.empty())
            {
                m_values.resize(range.size());

                std::stack<k_ary_search_set_branch> branches;

                branches.push({0, size(), perfect_tree_height(m_arity, size()), 0});
                while (not branches.empty())
                {
                    const auto branch = branches.top();
                    branches.pop();

                    // Количество меньших элементов ветки для каждого элемента текущего узла.
                    std::vector<std::size_t> counters;
                    fill_counters(branch, counters);

                    fill_node(branch, counters, range);

                    if (counters[0] > 0)
                    {
                        branches.push
                        ({
                            perfect_tree_child_index(m_arity, branch.index, 0),
                            counters[0],
                            branch.height - 1,
                            branch.preceding_elements
                        });
                    }

                    for
                    (
                        std::size_t i = 1;
                        i < counters.size() && (counters[i] - counters[i - 1] - 1) > 0;
                        ++i
                    )
                    {
                        branches.push
                        ({
                            perfect_tree_child_index(m_arity, branch.index, i),
                            counters[i] - counters[i - 1] - 1,
                            branch.height - 1,
                            branch.preceding_elements + counters[i - 1] + 1
                        });
                    }
                }
            }
        }